

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaEnumBuilder::setMetaType(QMetaEnumBuilder *this,QMetaType metaType)

{
  QMetaEnumBuilderPrivate *this_00;
  QMetaTypeInterface *in_RSI;
  QMetaEnumBuilder *in_RDI;
  long in_FS_OFFSET;
  QMetaEnumBuilderPrivate *d;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr = in_RSI;
  this_00 = d_func(in_RDI);
  if (this_00 != (QMetaEnumBuilderPrivate *)0x0) {
    (this_00->metaType).d_ptr = local_10.d_ptr;
    QMetaType::sizeOf(&local_10);
    setIs64Bit((QMetaEnumBuilder *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaEnumBuilder::setMetaType(QMetaType metaType)
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d) {
        d->metaType = metaType;
        setIs64Bit(metaType.sizeOf() > 4);
    }
}